

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O2

void __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
update_superroot_key_domain
          (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *this)

{
  model_node_type *pmVar1;
  int iVar2;
  int iVar3;
  undefined1 auVar4 [16];
  double dVar5;
  undefined1 auVar6 [16];
  undefined8 in_XMM2_Qb;
  
  if (((this->stats_).num_inserts != 0) && (this->root_node_->is_leaf_ == false)) {
    __assert_fail("stats_.num_inserts == 0 || root_node_->is_leaf_",
                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/core/alex.h"
                  ,0x2c1,
                  "void alex::Alex<int, int>::update_superroot_key_domain() [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = true]"
                 );
  }
  iVar2 = get_min_key(this);
  (this->istats_).key_domain_min_ = iVar2;
  iVar3 = get_max_key(this);
  (this->istats_).key_domain_max_ = iVar3;
  iVar2 = (this->stats_).num_keys;
  (this->istats_).num_keys_at_last_right_domain_resize = iVar2;
  (this->istats_).num_keys_at_last_left_domain_resize = iVar2;
  (this->istats_).num_keys_above_key_domain = 0;
  (this->istats_).num_keys_below_key_domain = 0;
  iVar2 = (this->istats_).key_domain_min_;
  pmVar1 = this->superroot_;
  dVar5 = 1.0 / (double)(iVar3 - iVar2);
  auVar6._0_8_ = (double)iVar2;
  auVar6._8_8_ = in_XMM2_Qb;
  auVar4._8_8_ = 0x8000000000000000;
  auVar4._0_8_ = 0x8000000000000000;
  auVar4 = vxorpd_avx512vl(auVar6,auVar4);
  (pmVar1->super_AlexNode<int,_int>).model_.a_ = dVar5;
  (pmVar1->super_AlexNode<int,_int>).model_.b_ = dVar5 * auVar4._0_8_;
  return;
}

Assistant:

void update_superroot_key_domain() {
    assert(stats_.num_inserts == 0 || root_node_->is_leaf_);
    istats_.key_domain_min_ = get_min_key();
    istats_.key_domain_max_ = get_max_key();
    istats_.num_keys_at_last_right_domain_resize = stats_.num_keys;
    istats_.num_keys_at_last_left_domain_resize = stats_.num_keys;
    istats_.num_keys_above_key_domain = 0;
    istats_.num_keys_below_key_domain = 0;
    superroot_->model_.a_ =
        1.0 / (istats_.key_domain_max_ - istats_.key_domain_min_);
    superroot_->model_.b_ =
        -1.0 * istats_.key_domain_min_ * superroot_->model_.a_;
  }